

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.c
# Opt level: O0

int ASN1_object_size(int constructed,int length,int tag)

{
  int tmplen;
  int ret;
  int tag_local;
  int length_local;
  int constructed_local;
  undefined4 local_4;
  
  ret = 1;
  if (length < 0) {
    local_4 = -1;
  }
  else {
    tag_local = tag;
    if (0x1e < tag) {
      for (; 0 < tag_local; tag_local = tag_local >> 7) {
        ret = ret + 1;
      }
    }
    if (constructed == 2) {
      ret = ret + 3;
    }
    else {
      ret = ret + 1;
      tmplen = length;
      if (0x7f < length) {
        for (; 0 < tmplen; tmplen = tmplen >> 8) {
          ret = ret + 1;
        }
      }
    }
    if (ret < 0x7fffffff - length) {
      local_4 = ret + length;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int ASN1_object_size(int constructed, int length, int tag)
{
    int ret = 1;

    if (length < 0)
        return -1;
    if (tag >= 31) {
        while (tag > 0) {
            tag >>= 7;
            ret++;
        }
    }
    if (constructed == 2) {
        ret += 3;
    } else {
        ret++;
        if (length > 127) {
            int tmplen = length;
            while (tmplen > 0) {
                tmplen >>= 8;
                ret++;
            }
        }
    }
    if (ret >= INT_MAX - length)
        return -1;
    return ret + length;
}